

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

SUNErrCode
N_VSetSubvectorArrayPointer_ManyVector(sunrealtype *v_data,N_Vector v,sunindextype vec_num)

{
  N_VSetArrayPointer(v_data,*(undefined8 *)(*(long *)((long)v->content + 0x10) + vec_num * 8));
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VSetSubvectorArrayPointer)(sunrealtype* v_data, N_Vector v,
                                                 sunindextype vec_num)
{
  SUNFunctionBegin(v->sunctx);
  SUNAssert(vec_num >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(vec_num < MANYVECTOR_NUM_SUBVECS(v), SUN_ERR_ARG_OUTOFRANGE);
  N_VSetArrayPointer(v_data, MANYVECTOR_SUBVEC(v, vec_num));
  SUNCheckLastErr();
  return SUN_SUCCESS;
}